

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::CallbackErrorCase::expectMessage
          (CallbackErrorCase *this,GLenum source,GLenum type)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  BaseCase::verifyMessage(&this->super_BaseCase,&this->m_lastMessage,source,type);
  local_30 = 0;
  local_28 = 0;
  (this->m_lastMessage).id.source = 0;
  (this->m_lastMessage).id.type = 0;
  *(undefined8 *)&(this->m_lastMessage).id.id = 0;
  local_38 = &local_28;
  std::__cxx11::string::operator=((string *)&(this->m_lastMessage).message,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  iVar1 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  return;
}

Assistant:

void CallbackErrorCase::expectMessage (GLenum source, GLenum type)
{
	verifyMessage(m_lastMessage, source, type);
	m_lastMessage = MessageData();

	// Reset error so that code afterwards (such as glu::ShaderProgram) doesn't break because of
	// lingering error state.
	m_context.getRenderContext().getFunctions().getError();
}